

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O1

void __thiscall CaDiCaL::LratChecker::insert(LratChecker *this)

{
  int64_t *piVar1;
  ulong uVar2;
  LratCheckerClause **ppLVar3;
  uint uVar4;
  LratCheckerClause *pLVar5;
  sbyte sVar6;
  ulong uVar7;
  
  piVar1 = &(this->stats).insertions;
  *piVar1 = *piVar1 + 1;
  if (this->num_clauses == this->size_clauses) {
    enlarge_clauses(this);
  }
  uVar7 = this->last_id * this->nonces[(uint)this->last_id & 3];
  uVar2 = this->size_clauses;
  this->last_hash = uVar7;
  if (uVar2 >> 0x20 == 0) {
    uVar4 = 0x20;
    do {
      sVar6 = (sbyte)uVar4;
      uVar4 = uVar4 >> 1;
      uVar7 = uVar7 ^ uVar7 >> sVar6;
    } while (uVar2 >> (sbyte)uVar4 == 0);
  }
  uVar7 = uVar2 - 1 & uVar7;
  pLVar5 = new_clause(this);
  ppLVar3 = this->clauses;
  pLVar5->next = ppLVar3[uVar7];
  ppLVar3[uVar7] = pLVar5;
  return;
}

Assistant:

void LratChecker::insert () {
  stats.insertions++;
  if (num_clauses == size_clauses)
    enlarge_clauses ();
  const uint64_t h = reduce_hash (compute_hash (last_id), size_clauses);
  LratCheckerClause *c = new_clause ();
  c->next = clauses[h];
  clauses[h] = c;
}